

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

_Bool nhdp_domain_set_incoming_metric(nhdp_domain_metric *metric,nhdp_link *lnk,uint32_t metric_in)

{
  int iVar1;
  _Bool _Var2;
  uint32_t uVar3;
  uint64_t uVar4;
  nhdp_link_domaindata *pnVar5;
  list_entity *plVar6;
  list_entity *plVar7;
  
  if ((_domain_list.next)->prev == _domain_list.prev) {
    _Var2 = false;
  }
  else {
    _Var2 = false;
    plVar6 = _domain_list.next;
    do {
      if ((nhdp_domain_metric *)plVar6[-0x28].next == metric) {
        iVar1 = *(int *)((long)&plVar6[-0x27].next + 4);
        uVar3 = metric_in;
        if ((_domain_metric_postprocessor_list.next)->prev != _domain_metric_postprocessor_list.prev
           ) {
          plVar7 = _domain_metric_postprocessor_list.next;
          do {
            uVar3 = (*(code *)plVar7[-1].prev)(plVar6 + -0x2a,lnk,uVar3);
            plVar7 = plVar7->next;
          } while (plVar7->prev != _domain_metric_postprocessor_list.prev);
        }
        pnVar5 = lnk->_domaindata + iVar1;
        if ((pnVar5->metric).in != uVar3) {
          uVar4 = oonf_clock_getNow();
          pnVar5->last_metric_change = uVar4;
          _Var2 = true;
        }
        (pnVar5->metric).in = uVar3;
      }
      plVar6 = plVar6->next;
    } while (plVar6->prev != _domain_list.prev);
  }
  return _Var2;
}

Assistant:

bool
nhdp_domain_set_incoming_metric(struct nhdp_domain_metric *metric, struct nhdp_link *lnk, uint32_t metric_in) {
  struct nhdp_domain_metric_postprocessor *processor;
  struct nhdp_link_domaindata *linkdata;
  struct nhdp_domain *domain;
  uint32_t new_metric;
  bool changed;

  changed = false;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->metric == metric) {
      linkdata = nhdp_domain_get_linkdata(domain, lnk);
      new_metric = metric_in;

      list_for_each_element(&_domain_metric_postprocessor_list, processor, _node) {
        new_metric = processor->process_in_metric(domain, lnk, new_metric);
      }

      if (linkdata->metric.in != new_metric) {
        changed = true;
        linkdata->last_metric_change = oonf_clock_getNow();
      }
      linkdata->metric.in = new_metric;
    }
  }
  return changed;
}